

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zp_field_operators.h
# Opt level: O0

void __thiscall
Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
          (Zp_field_operators<unsigned_int,_void> *this,Element *e1,Element e2)

{
  Element EVar1;
  Element e2_00;
  Element e2_local;
  Element *e1_local;
  Zp_field_operators<unsigned_int,_void> *this_local;
  
  EVar1 = get_value(this,*e1);
  e2_00 = get_value(this,e2);
  EVar1 = _multiply(EVar1,e2_00,this->characteristic_);
  *e1 = EVar1;
  return;
}

Assistant:

void multiply_inplace(Element& e1, Element e2) const {
    e1 = _multiply(get_value(e1), get_value(e2), characteristic_);
  }